

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O2

Value * __thiscall
duckdb::Appender::GetDefaultValue(Value *__return_storage_ptr__,Appender *this,idx_t column)

{
  pointer pLVar1;
  pointer pLVar2;
  reference pvVar3;
  iterator iVar4;
  pointer pTVar5;
  reference this_00;
  string *psVar6;
  NotImplementedException *this_01;
  InvalidInputException *this_02;
  allocator local_61;
  idx_t index;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  pLVar1 = (this->column_ids).
           super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>.
           super__Vector_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>._M_impl.
           super__Vector_impl_data._M_start;
  pLVar2 = (this->column_ids).
           super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>.
           super__Vector_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>._M_impl.
           super__Vector_impl_data._M_finish;
  index = column;
  if (pLVar1 != pLVar2) {
    if ((ulong)((long)pLVar2 - (long)pLVar1 >> 3) <= column) {
      this_02 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string((string *)&local_58,"Column index out of bounds",&local_61);
      InvalidInputException::InvalidInputException(this_02,&local_58);
      __cxa_throw(this_02,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pvVar3 = vector<duckdb::LogicalIndex,_true>::get<true>(&this->column_ids,column);
    index = pvVar3->index;
  }
  iVar4 = ::std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::Value>,_std::allocator<std::pair<const_unsigned_long,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->default_values)._M_h,&index);
  if (iVar4.super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::Value>,_false>._M_cur
      != (__node_type *)0x0) {
    Value::Value(__return_storage_ptr__,
                 (Value *)((long)iVar4.
                                 super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::Value>,_false>
                                 ._M_cur + 0x10));
    return __return_storage_ptr__;
  }
  pTVar5 = unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>,_true>
           ::operator->(&this->description);
  this_00 = vector<duckdb::ColumnDefinition,_true>::get<true>(&pTVar5->columns,index);
  psVar6 = ColumnDefinition::Name_abi_cxx11_(this_00);
  this_01 = (NotImplementedException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_58,
             "AppendDefault is not supported for column \"%s\": not a foldable default expressions."
             ,&local_61);
  ::std::__cxx11::string::string((string *)&local_38,(string *)psVar6);
  NotImplementedException::NotImplementedException<std::__cxx11::string>
            (this_01,&local_58,&local_38);
  __cxa_throw(this_01,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

Value Appender::GetDefaultValue(idx_t column) {
	auto index = column;

	if (!column_ids.empty()) {
		if (column >= column_ids.size()) {
			throw InvalidInputException("Column index out of bounds");
		}
		index = column_ids[column].index;
	}

	auto it = default_values.find(index);
	if (it == default_values.end()) {
		auto &name = description->columns[index].Name();
		throw NotImplementedException(
		    "AppendDefault is not supported for column \"%s\": not a foldable default expressions.", name);
	}
	return it->second;
}